

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O2

void __thiscall
sensors_analytics::utils::ObjectNode::SetString(ObjectNode *this,string *property_name,char *value)

{
  ostream *poVar1;
  allocator local_39;
  string local_38;
  
  if (value != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_38,value,&local_39);
    SetString(this,property_name,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"String property \'");
  poVar1 = std::operator<<(poVar1,(string *)property_name);
  poVar1 = std::operator<<(poVar1,"\' value is NULL");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void ObjectNode::SetString(const string &property_name, const char *value) {
  if (value == NULL) {
    std::cerr << "String property '" << property_name
              << "' value is NULL"<< std::endl;
    return;
  }
  SetString(property_name, string(value));
}